

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::RepeatedMessageFieldGenerator::DetermineForwardDeclarations
          (RepeatedMessageFieldGenerator *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *fwd_decls)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  FieldGenerator::DetermineForwardDeclarations((FieldGenerator *)this,fwd_decls);
  FieldGenerator::variable_abi_cxx11_(&local_38,(FieldGenerator *)this,"storage_type");
  std::operator+(&bStack_58,"@class ",&local_38);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)fwd_decls,&bStack_58);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::DetermineForwardDeclarations(
    std::set<string>* fwd_decls) const {
  RepeatedFieldGenerator::DetermineForwardDeclarations(fwd_decls);
  // Class name is already in "storage_type".
  fwd_decls->insert("@class " + variable("storage_type"));
}